

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Int_t * Saig_ManBmcComputeMappingRefs(Aig_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Int_t *p_00;
  void *pvVar2;
  int *piVar3;
  int Addition;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = p->vObjs->nSize;
  p_00 = Vec_IntAlloc(iVar5);
  p_00->nSize = iVar5;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)iVar5 << 2);
  }
  iVar5 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar5) break;
    pvVar2 = Vec_PtrEntry(p->vCos,iVar5);
    iVar1 = -1;
    if (*(ulong *)((long)pvVar2 + 8) != 0) {
      iVar1 = *(int *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x24);
    }
    Vec_IntAddToEntry(p_00,iVar1,Addition);
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar5);
    if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
      iVar1 = Vec_IntEntry(vMap,iVar5);
      if (iVar1 != 0) {
        iVar1 = Vec_IntEntry(vMap,iVar5);
        piVar3 = Vec_IntEntryP(vMap,iVar1);
        uVar4 = extraout_RDX;
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          if (-1 < piVar3[lVar6 + 1]) {
            Vec_IntAddToEntry(p_00,piVar3[lVar6 + 1],(int)uVar4);
            uVar4 = extraout_RDX_00;
          }
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Saig_ManBmcComputeMappingRefs( Aig_Man_t * p, Vec_Int_t * vMap )
{
    Vec_Int_t * vRefs;
    Aig_Obj_t * pObj;
    int i, iFan, * pData;
    vRefs = Vec_IntStart( Aig_ManObjNumMax(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntAddToEntry( vRefs, Aig_ObjFaninId0(pObj), 1 );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMap, Vec_IntEntry(vMap, i) );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                Vec_IntAddToEntry( vRefs, pData[iFan+1], 1 );
    }
    return vRefs;
}